

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  plan(3);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  test_class();
  check_expectation();
  check_factor();
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main(void)
{
	plan(3);
	header();

	test_class();
	check_expectation();
	check_factor();

	footer();
	return check_plan();
}